

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall
HighFreqDataType::HighFreqDataType
          (HighFreqDataType *this,string *n,string *o,string *dformat,string *sock,int bsize)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  NetworkDataType *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__HighFreqDataType_003755b0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 5),in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 9),in_RCX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),in_R8);
  *(undefined4 *)&in_RDI[0x11]._vptr_NetworkDataType = in_R9D;
  return;
}

Assistant:

HighFreqDataType::HighFreqDataType(std::string n, std::string o, std::string dformat, std::string sock, int bsize){
    name = n;
    origin = o;
    dataFormat = dformat;
    sockAddr = sock;
    byteSize = bsize;
}